

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O0

BufferHandle * __thiscall
duckdb::StandardBufferManager::Allocate
          (StandardBufferManager *this,MemoryTag tag,idx_t block_size,bool can_destroy)

{
  BufferHandle *in_RDI;
  undefined1 in_R8B;
  shared_ptr<duckdb::BlockHandle,_true> block;
  shared_ptr<duckdb::BlockHandle,_true> *in_stack_000001a0;
  StandardBufferManager *in_stack_000001a8;
  bool in_stack_ffffffffffffffc7;
  idx_t in_stack_ffffffffffffffc8;
  MemoryTag in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffd8;
  
  AllocateTemporaryMemory
            ((StandardBufferManager *)
             (CONCAT17(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
  Pin(in_stack_000001a8,in_stack_000001a0);
  shared_ptr<duckdb::BlockHandle,_true>::~shared_ptr
            ((shared_ptr<duckdb::BlockHandle,_true> *)0xc52799);
  return in_RDI;
}

Assistant:

BufferHandle StandardBufferManager::Allocate(MemoryTag tag, idx_t block_size, bool can_destroy) {
	auto block = AllocateTemporaryMemory(tag, block_size, can_destroy);

#ifdef DUCKDB_DEBUG_DESTROY_BLOCKS
	// Initialize the memory with garbage data
	WriteGarbageIntoBuffer(*block);
#endif
	return Pin(block);
}